

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::write_decimal<unsigned__int128>
          (basic_writer<fmt::v6::buffer_range<char>> *this,unsigned___int128 value)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  int iVar5;
  byte bVar6;
  long lVar7;
  ulong in_RDX;
  ptrdiff_t _Num;
  int iVar8;
  ulong in_RSI;
  ulong uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  size_t __n;
  undefined1 auVar12 [16];
  undefined1 local_88 [88];
  
  auVar4._8_8_ = in_RDX;
  auVar4._0_8_ = in_RSI;
  iVar8 = 1;
  if ((in_RSI < 10) <= in_RDX) {
    iVar5 = 4;
    auVar12 = auVar4;
    do {
      iVar8 = iVar5;
      uVar9 = auVar12._8_8_;
      uVar11 = auVar12._0_8_;
      if (uVar9 == 0 && (ulong)(99 < uVar11) <= -uVar9) {
        iVar8 = iVar8 + -2;
        goto LAB_00131e5f;
      }
      if (uVar9 == 0 && (ulong)(999 < uVar11) <= -uVar9) {
        iVar8 = iVar8 + -1;
        goto LAB_00131e5f;
      }
      if (uVar9 < (uVar11 < 10000)) goto LAB_00131e5f;
      auVar12 = __udivti3(uVar11,uVar9,10000,0);
      iVar5 = iVar8 + 4;
    } while (uVar9 != 0 || -uVar9 < (ulong)(99999 < uVar11));
    iVar8 = iVar8 + 1;
  }
LAB_00131e5f:
  __n = (size_t)iVar8;
  puVar1 = *(undefined8 **)this;
  lVar2 = puVar1[2];
  uVar9 = lVar2 + __n;
  if ((ulong)puVar1[3] < uVar9) {
    (**(code **)*puVar1)(puVar1,uVar9);
  }
  puVar1[2] = uVar9;
  lVar3 = puVar1[1];
  puVar10 = local_88 + __n;
  auVar12 = auVar4;
  if ((in_RSI < 100) <= in_RDX) {
    do {
      lVar7 = auVar4._8_8_;
      uVar11 = auVar4._0_8_;
      auVar12 = __udivti3(uVar11,lVar7,100,0);
      uVar9 = (ulong)(uint)(auVar4._0_4_ + auVar12._0_4_ * -100);
      puVar10[-1] = basic_data<void>::digits[(uVar9 * 2 & 0xffffffff) + 1];
      puVar10[-2] = basic_data<void>::digits[uVar9 * 2];
      puVar10 = puVar10 + -2;
      auVar4 = auVar12;
    } while (lVar7 != 0 || (ulong)-lVar7 < (ulong)(9999 < uVar11));
  }
  if (auVar12._8_8_ == 0 && (ulong)(9 < auVar12._0_8_) <= (ulong)-auVar12._8_8_) {
    bVar6 = auVar12[0] | 0x30;
    lVar7 = -1;
  }
  else {
    uVar9 = auVar12._0_8_ * 2;
    puVar10[-1] = basic_data<void>::digits[(uVar9 & 0xffffffff) + 1];
    bVar6 = basic_data<void>::digits[uVar9 & 0x1fffffffe];
    lVar7 = -2;
  }
  puVar10[lVar7] = bVar6;
  memcpy((void *)(lVar3 + lVar2),local_88,__n);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }